

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::endElement(XmlWriter *this)

{
  ostream *poVar1;
  reference pvVar2;
  XmlWriter *in_RDI;
  XmlWriter *in_stack_ffffffffffffffc0;
  string local_28 [40];
  
  newlineIfNecessary(in_stack_ffffffffffffffc0);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_28,(ulong)&in_RDI->m_indent);
  std::__cxx11::string::operator=((string *)&in_RDI->m_indent,local_28);
  std::__cxx11::string::~string(local_28);
  if ((in_RDI->m_tagIsOpen & 1U) == 0) {
    poVar1 = stream(in_RDI);
    poVar1 = std::operator<<(poVar1,(string *)&in_RDI->m_indent);
    poVar1 = std::operator<<(poVar1,"</");
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)poVar1);
    poVar1 = std::operator<<(poVar1,(string *)pvVar2);
    std::operator<<(poVar1,">\n");
  }
  else {
    poVar1 = stream(in_RDI);
    std::operator<<(poVar1,"/>\n");
    in_RDI->m_tagIsOpen = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x24446d);
  return in_RDI;
}

Assistant:

XmlWriter& endElement() {
            newlineIfNecessary();
            m_indent = m_indent.substr( 0, m_indent.size()-2 );
            if( m_tagIsOpen ) {
                stream() << "/>\n";
                m_tagIsOpen = false;
            }
            else {
                stream() << m_indent << "</" << m_tags.back() << ">\n";
            }
            m_tags.pop_back();
            return *this;
        }